

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

ExtensionInitResult *
duckdb::ExtensionHelper::InitialLoad
          (ExtensionInitResult *__return_storage_ptr__,DatabaseInstance *db,FileSystem *fs,
          string *extension)

{
  bool bVar1;
  DBConfig *pDVar2;
  IOException *pIVar3;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_80;
  string error;
  ExtensionInstallOptions options;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  ExtensionInitResult::ExtensionInitResult(__return_storage_ptr__);
  bVar1 = TryInitialLoad(db,fs,extension,__return_storage_ptr__,&error);
  if (bVar1) {
LAB_004113f6:
    ::std::__cxx11::string::~string((string *)&error);
    return __return_storage_ptr__;
  }
  pDVar2 = DBConfig::GetConfig(db);
  if ((pDVar2->options).autoinstall_known_extensions == true) {
    bVar1 = AllowAutoInstall(extension);
    if (bVar1) {
      options.repository.ptr = (ExtensionRepository *)0x0;
      options.version._M_dataplus._M_p = (pointer)&options.version.field_2;
      options.version._M_string_length = 0;
      options.version.field_2._M_local_buf[0] = '\0';
      options.force_install = false;
      options.use_etags = false;
      options.throw_on_origin_mismatch = false;
      InstallExtension((ExtensionHelper *)&local_80,db,fs,extension,&options);
      ::std::
      unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
      ~unique_ptr(&local_80);
      bVar1 = TryInitialLoad(db,fs,extension,__return_storage_ptr__,&error);
      if (!bVar1) {
        pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
        IOException::IOException(pIVar3,&error);
        __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::~string((string *)&options.version);
      goto LAB_004113f6;
    }
  }
  pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
  IOException::IOException(pIVar3,&error);
  __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ExtensionInitResult ExtensionHelper::InitialLoad(DatabaseInstance &db, FileSystem &fs, const string &extension) {
	string error;
	ExtensionInitResult result;
	if (!TryInitialLoad(db, fs, extension, result, error)) {
		auto &config = DBConfig::GetConfig(db);
		if (!config.options.autoinstall_known_extensions || !ExtensionHelper::AllowAutoInstall(extension)) {
			throw IOException(error);
		}
		// the extension load failed - try installing the extension
		ExtensionInstallOptions options;
		ExtensionHelper::InstallExtension(db, fs, extension, options);
		// try loading again
		if (!TryInitialLoad(db, fs, extension, result, error)) {
			throw IOException(error);
		}
	}
	return result;
}